

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image.h
# Opt level: O1

int stbi__high_bit(uint z)

{
  uint uVar1;
  uint uVar2;
  int iVar3;
  int iVar4;
  
  if (z == 0) {
    return -1;
  }
  uVar2 = z >> 0x10;
  if (0xffff >= z) {
    uVar2 = z;
  }
  iVar3 = (uint)(0xffff < z) * 0x10;
  iVar4 = iVar3 + 8;
  uVar1 = uVar2 >> 8;
  if (uVar2 < 0x100) {
    iVar4 = iVar3;
    uVar1 = uVar2;
  }
  iVar3 = iVar4 + 4;
  uVar2 = uVar1 >> 4;
  if (uVar1 < 0x10) {
    iVar3 = iVar4;
    uVar2 = uVar1;
  }
  iVar4 = iVar3 + 2;
  uVar1 = uVar2 >> 2;
  if (uVar2 < 4) {
    iVar4 = iVar3;
    uVar1 = uVar2;
  }
  return (iVar4 + 1) - (uint)(uVar1 < 2);
}

Assistant:

static int stbi__high_bit(unsigned int z)
{
   int n=0;
   if (z == 0) return -1;
   if (z >= 0x10000) { n += 16; z >>= 16; }
   if (z >= 0x00100) { n +=  8; z >>=  8; }
   if (z >= 0x00010) { n +=  4; z >>=  4; }
   if (z >= 0x00004) { n +=  2; z >>=  2; }
   if (z >= 0x00002) { n +=  1;/* >>=  1;*/ }
   return n;
}